

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFun.cpp
# Opt level: O0

void testf(float f,bool changeExpected)

{
  uint uVar1;
  uint uVar2;
  byte in_DIL;
  float in_XMM0_Da;
  float from;
  float from_00;
  float fVar3;
  float fVar4;
  float psf;
  float spf;
  float pf;
  float sf;
  
  printf("\n");
  from = (float)Imath_3_2::succf(in_XMM0_Da);
  from_00 = (float)Imath_3_2::predf(in_XMM0_Da);
  fVar3 = (float)Imath_3_2::predf(in_XMM0_Da);
  fVar3 = (float)Imath_3_2::succf(fVar3);
  fVar4 = (float)Imath_3_2::succf(in_XMM0_Da);
  fVar4 = (float)Imath_3_2::predf(fVar4);
  uVar1 = bit_cast<unsigned_int,float>(in_XMM0_Da);
  printf("f %.9g %x\n",(double)in_XMM0_Da,(ulong)uVar1);
  uVar1 = bit_cast<unsigned_int,float>(from);
  printf("sf %.9g %x\n",(double)from,(ulong)uVar1);
  uVar1 = bit_cast<unsigned_int,float>(from_00);
  printf("pf %.9g %x\n",(double)from_00,(ulong)uVar1);
  uVar1 = bit_cast<unsigned_int,float>(fVar3);
  printf("spf %.9g %x\n",(double)fVar3,(ulong)uVar1);
  uVar1 = bit_cast<unsigned_int,float>(fVar4);
  printf("psf %.9g %x\n",(double)fVar4,(ulong)uVar1);
  fflush(_stdout);
  if ((in_DIL & 1) == 0) {
    uVar1 = std::isnan((double)(ulong)(uint)in_XMM0_Da);
    if ((uVar1 & 1) == 0) {
      uVar1 = bit_cast<unsigned_int,float>(from_00);
      uVar2 = bit_cast<unsigned_int,float>(in_XMM0_Da);
      if (uVar1 != uVar2) {
        __assert_fail("bit_cast<uint32_t> (pf) == bit_cast<uint32_t> (f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x4c,"void testf(float, bool)");
      }
      uVar1 = bit_cast<unsigned_int,float>(from);
      uVar2 = bit_cast<unsigned_int,float>(in_XMM0_Da);
      if (uVar1 != uVar2) {
        __assert_fail("bit_cast<uint32_t> (sf) == bit_cast<uint32_t> (f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x4d,"void testf(float, bool)");
      }
    }
    else {
      uVar1 = std::isnan((double)(ulong)(uint)from_00);
      if ((uVar1 & 1) == 0) {
        __assert_fail("isnan (pf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x46,"void testf(float, bool)");
      }
      uVar1 = std::isnan((double)(ulong)(uint)from);
      if ((uVar1 & 1) == 0) {
        __assert_fail("isnan (sf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                      ,0x47,"void testf(float, bool)");
      }
    }
  }
  else {
    if (in_XMM0_Da <= from_00) {
      __assert_fail("pf < f",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                    ,0x3d,"void testf(float, bool)");
    }
    if (from <= in_XMM0_Da) {
      __assert_fail("f < sf",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testFun.cpp"
                    ,0x3e,"void testf(float, bool)");
    }
  }
  return;
}

Assistant:

void
testf (float f, bool changeExpected = true)
{
    printf ("\n");

    float sf = IMATH_INTERNAL_NAMESPACE::succf (f);
    float pf = IMATH_INTERNAL_NAMESPACE::predf (f);
    float spf =
        IMATH_INTERNAL_NAMESPACE::succf (IMATH_INTERNAL_NAMESPACE::predf (f));
    float psf =
        IMATH_INTERNAL_NAMESPACE::predf (IMATH_INTERNAL_NAMESPACE::succf (f));

    printf ("f %.9g %" PRIx32 "\n", f, bit_cast<uint32_t> (f));
    printf ("sf %.9g %" PRIx32 "\n", sf, bit_cast<uint32_t> (sf));
    printf ("pf %.9g %" PRIx32 "\n", pf, bit_cast<uint32_t> (pf));
    printf ("spf %.9g %" PRIx32 "\n", spf, bit_cast<uint32_t> (spf));
    printf ("psf %.9g %" PRIx32 "\n", psf, bit_cast<uint32_t> (psf));

    fflush (stdout);

    if (changeExpected)
    {
        assert (pf < f);
        assert (f < sf);
    }
    else
    {
        if (isnan (f))
        {
            // If f is nan, pf and sf may be converted from signaling
            // to quiet nan, but they'll still be nan's.
            assert (isnan (pf));
            assert (isnan (sf));
        }
        else
        {
            // No bit change expected if input was inf.
            assert (bit_cast<uint32_t> (pf) == bit_cast<uint32_t> (f));
            assert (bit_cast<uint32_t> (sf) == bit_cast<uint32_t> (f));
        }
    }
}